

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_object_pool.h
# Opt level: O2

pointer __thiscall
Gudhi::
Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>>::
construct<unsigned_int&>
          (Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>>
           *this,uint *u)

{
  uint uVar1;
  pointer pPVar2;
  
  pPVar2 = (pointer)boost::pool<boost::default_user_allocator_malloc_free>::malloc
                              ((pool<boost::default_user_allocator_malloc_free> *)this,(size_t)u);
  if (pPVar2 != (pointer)0x0) {
    uVar1 = *u;
    (pPVar2->col_).super_type.data_.root_plus_size_.m_header.super_node.next_ =
         (node_ptr)&pPVar2->col_;
    (pPVar2->col_).super_type.data_.root_plus_size_.m_header.super_node.prev_ =
         (node_ptr)&pPVar2->col_;
    pPVar2->class_key_ = uVar1;
    return pPVar2;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Simple_object_pool.h"
                ,0x33,
                "pointer Gudhi::Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned int, int>>::construct(U &&...) [T = Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned int, int>, U = <unsigned int &>]"
               );
}

Assistant:

pointer construct(U&&...u) {
    void* p = base().malloc BOOST_PREVENT_MACRO_SUBSTITUTION();
    assert(p);
    try {
      new(p) T(std::forward<U>(u)...);
    }    catch (...) {
      base().free BOOST_PREVENT_MACRO_SUBSTITUTION(p);
      throw;
    }
    return static_cast<pointer> (p);
  }